

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateAbstractMethods
          (ImmutableServiceGenerator *this,Printer *printer)

{
  int iVar1;
  MethodDescriptor *method_00;
  MethodDescriptor *method;
  int i;
  Printer *printer_local;
  ImmutableServiceGenerator *this_local;
  
  method._4_4_ = 0;
  while( true ) {
    iVar1 = ServiceDescriptor::method_count((this->super_ServiceGenerator).descriptor_);
    if (iVar1 <= method._4_4_) break;
    method_00 = ServiceDescriptor::method((this->super_ServiceGenerator).descriptor_,method._4_4_);
    WriteMethodDocComment(printer,method_00);
    GenerateMethodSignature(this,printer,method_00,IS_ABSTRACT);
    io::Printer::Print<>(printer,";\n\n");
    method._4_4_ = method._4_4_ + 1;
  }
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateAbstractMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    WriteMethodDocComment(printer, method);
    GenerateMethodSignature(printer, method, IS_ABSTRACT);
    printer->Print(";\n\n");
  }
}